

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_vendorio.cpp
# Opt level: O1

void __thiscall StreamVendorIo::PrintErrorMessage(StreamVendorIo *this,char *fmt,...)

{
  ostream *poVar1;
  char in_AL;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *formatted;
  va_list args;
  char *local_f0;
  undefined8 local_e8;
  char **local_e0;
  undefined1 *local_d8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  local_d8 = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_e8 = 0x3000000010;
  local_e0 = &formatted;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  vasprintf(&local_f0,fmt,&local_e8);
  poVar1 = this->os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Error: ",7);
  if (local_f0 == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(local_f0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_f0,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,".",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void StreamVendorIo::PrintErrorMessage(const char *fmt, ...) {
    va_list args;
    char *formatted;
    va_start(args, fmt);
    vasprintf(&formatted, fmt, args);
    os << "Error: " << formatted << "." << endl;
    va_end(args);
}